

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

bool __thiscall doctest::AssertData::StringContains::check(StringContains *this,String *str)

{
  bool local_21;
  String *str_local;
  StringContains *this_local;
  
  if ((this->isContains & 1U) == 0) {
    local_21 = doctest::operator==((String *)this,str);
  }
  else {
    local_21 = doctest::operator==(&this->content,str);
  }
  return local_21;
}

Assistant:

bool check(const String& str) { return isContains ? (content == str) : (content.string == str); }